

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * sqlite3WindowOffsetExpr(Parse *pParse,Expr *pExpr)

{
  int iVar1;
  sqlite3 *in_RSI;
  Parse *in_RDI;
  Token *unaff_retaddr;
  Expr *in_stack_ffffffffffffffe8;
  
  iVar1 = sqlite3ExprIsConstant((Parse *)in_RSI,in_stack_ffffffffffffffe8);
  if (iVar1 == 0) {
    if (1 < in_RDI->eParseMode) {
      sqlite3RenameExprUnmap(in_RDI,(Expr *)in_RSI);
    }
    iVar1 = (int)((ulong)in_RDI >> 0x20);
    sqlite3ExprDelete(in_RSI,in_stack_ffffffffffffffe8);
    in_RSI = (sqlite3 *)sqlite3ExprAlloc((sqlite3 *)pParse,pExpr._4_4_,unaff_retaddr,iVar1);
  }
  return (Expr *)in_RSI;
}

Assistant:

static Expr *sqlite3WindowOffsetExpr(Parse *pParse, Expr *pExpr){
  if( 0==sqlite3ExprIsConstant(0,pExpr) ){
    if( IN_RENAME_OBJECT ) sqlite3RenameExprUnmap(pParse, pExpr);
    sqlite3ExprDelete(pParse->db, pExpr);
    pExpr = sqlite3ExprAlloc(pParse->db, TK_NULL, 0, 0);
  }
  return pExpr;
}